

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeDependencies.cpp
# Opt level: O2

TimeProcessingResult __thiscall
helics::TimeDependencies::updateTime(TimeDependencies *this,ActionMessage *cmd)

{
  ConnectionType CVar1;
  bool bVar2;
  ushort uVar3;
  uint16_t uVar4;
  action_t aVar5;
  baseType bVar6;
  long lVar7;
  DependencyInfo *pDVar8;
  TimeProcessingResult TVar9;
  TimeProcessingResult TVar10;
  uint uVar11;
  TimeState TVar12;
  long lVar13;
  
  pDVar8 = getDependencyInfo(this,(GlobalFederateId)(cmd->source_id).gid);
  if ((pDVar8 == (DependencyInfo *)0x0) || (pDVar8->dependency != true)) {
    return NOT_PROCESSED;
  }
  aVar5 = cmd->messageAction;
  if ((((uint)(aVar5 + (cmd_route_ack|cmd_init)) < 4) || (aVar5 == cmd_priority_disconnect)) ||
     (aVar5 == cmd_disconnect)) {
    (pDVar8->super_TimeData).mTimeState = time_granted;
    (pDVar8->super_TimeData).hasData = false;
    (pDVar8->super_TimeData).next.internalTimeCode = 0x7fffffffffffffff;
    (pDVar8->super_TimeData).Te.internalTimeCode = 0x7fffffffffffffff;
    (pDVar8->super_TimeData).minDe.internalTimeCode = 0x7fffffffffffffff;
    (pDVar8->super_TimeData).minFed.gid = -2010000000;
    (pDVar8->super_TimeData).timeoutCount = 0;
    pDVar8->updateRequested = false;
    return PROCESSED;
  }
  if (aVar5 == cmd_send_message) {
LAB_002dfb73:
    (pDVar8->super_TimeData).hasData = true;
  }
  else {
    if (aVar5 == cmd_exec_grant) {
      if ((cmd->flags & 1) == 0) {
        (pDVar8->super_TimeData).timeoutCount = 0;
        (pDVar8->super_TimeData).grantedIteration = 0;
        (pDVar8->super_TimeData).minDe.internalTimeCode = 0;
        (pDVar8->super_TimeData).next.internalTimeCode = 0;
        (pDVar8->super_TimeData).Te.internalTimeCode = 0;
        (pDVar8->super_TimeData).minFed.gid = -2010000000;
        uVar11 = 0;
        TVar12 = time_granted;
      }
      else {
        uVar11 = (uint)cmd->counter;
        TVar12 = initialized;
      }
      (pDVar8->super_TimeData).mTimeState = TVar12;
      (pDVar8->super_TimeData).sequenceCounter = uVar11;
      (pDVar8->super_TimeData).responseSequenceCounter = 0;
      (pDVar8->super_TimeData).restrictionLevel = '\0';
    }
    else {
      if (aVar5 != cmd_time_grant) {
        if (aVar5 == cmd_request_current_time) {
          (pDVar8->super_TimeData).sequenceCounter = (uint)cmd->counter;
          return PROCESSED;
        }
        if (aVar5 != cmd_pub) {
          if (aVar5 == cmd_timing_info) {
            uVar4 = cmd->flags;
            pDVar8->nonGranting = (bool)((byte)uVar4 >> 7);
            (pDVar8->super_TimeData).delayedTiming = (bool)((byte)(uVar4 >> 10) & 1);
            (pDVar8->super_TimeData).timingVersion = (int8_t)(cmd->dest_handle).hid;
            return PROCESSED_AND_CHECK;
          }
          if (aVar5 == cmd_time_request) {
            TVar9 = PROCESSED;
            if ((pDVar8->super_TimeData).mTimeState == time_granted) {
              (pDVar8->super_TimeData).lastGrant.internalTimeCode =
                   (pDVar8->super_TimeData).next.internalTimeCode;
              TVar9 = PROCESSED_NEW_REQUEST;
            }
            uVar3 = cmd->flags;
            TVar12 = time_requested;
            if ((uVar3 & 1) != 0) {
              TVar12 = (uVar3 & 4) == 0 | time_requested_require_iteration;
            }
            (pDVar8->super_TimeData).mTimeState = TVar12;
            (pDVar8->super_TimeData).next.internalTimeCode = (cmd->actionTime).internalTimeCode;
            lVar7 = (cmd->Te).internalTimeCode;
            (pDVar8->super_TimeData).Te.internalTimeCode = lVar7;
            lVar13 = (cmd->Tdemin).internalTimeCode;
            if (lVar7 < lVar13) {
              lVar13 = lVar7;
            }
            (pDVar8->super_TimeData).minDe.internalTimeCode = lVar13;
            (pDVar8->super_TimeData).minFed.gid = (cmd->dest_handle).hid;
            (pDVar8->super_TimeData).interrupted = (bool)((byte)(uVar3 >> 8) & 1);
            if ((char)(byte)uVar3 < '\0') {
              pDVar8->nonGranting = true;
            }
            TVar10 = PROCESSED_AND_CHECK;
            if (((pDVar8->super_TimeData).delayedTiming & 1U) != 0) {
              TVar10 = TVar9;
            }
            if ((uVar3 >> 10 & 1) != 0) {
              (pDVar8->super_TimeData).delayedTiming = true;
              TVar9 = TVar10;
            }
            pDVar8->triggered = (bool)((byte)uVar3 >> 1 & 1);
            uVar11 = (uint)cmd->counter;
            (pDVar8->super_TimeData).sequenceCounter = (uint)cmd->counter;
            if (pDVar8->connection != SELF) {
              uVar11 = (cmd->source_handle).hid;
            }
            (pDVar8->super_TimeData).responseSequenceCounter = uVar11;
            if (uVar11 != (pDVar8->super_TimeData).grantedIteration) {
              return TVar9;
            }
          }
          else {
            if ((aVar5 == cmd_local_error) || (aVar5 == cmd_global_error)) {
              (pDVar8->super_TimeData).mTimeState = error;
              (pDVar8->super_TimeData).next.internalTimeCode = 0x7fffffffffffffff;
              (pDVar8->super_TimeData).Te.internalTimeCode = 0x7fffffffffffffff;
              (pDVar8->super_TimeData).minDe.internalTimeCode = 0x7fffffffffffffff;
              (pDVar8->super_TimeData).minFed.gid = -2010000000;
              (pDVar8->super_TimeData).timeoutCount = 0;
              return PROCESSED;
            }
            if (aVar5 != cmd_exec_request) {
              return NOT_PROCESSED;
            }
            uVar3 = cmd->flags;
            TVar12 = exec_requested;
            if ((uVar3 & 1) != 0) {
              TVar12 = ((uVar3 & 4) == 0) + exec_requested_require_iteration;
            }
            (pDVar8->super_TimeData).mTimeState = TVar12;
            CVar1 = pDVar8->connection;
            bVar2 = (pDVar8->super_TimeData).delayedTiming;
            (pDVar8->super_TimeData).delayedTiming = SUB41((uVar3 & 0x400) >> 10,0);
            (pDVar8->super_TimeData).restrictionLevel = (uint8_t)cmd->messageID;
            uVar11 = (uint)cmd->counter;
            (pDVar8->super_TimeData).sequenceCounter = (uint)cmd->counter;
            (pDVar8->super_TimeData).minFed.gid = (cmd->dest_handle).hid;
            if (CVar1 != SELF) {
              uVar11 = (cmd->source_handle).hid;
            }
            TVar9 = PROCESSED_AND_CHECK - ((uVar3 & 0x400) == 0 | bVar2 & 1U);
            (pDVar8->super_TimeData).responseSequenceCounter = uVar11;
            if (uVar11 != (pDVar8->super_TimeData).grantedIteration) {
              return TVar9;
            }
          }
          pDVar8->updateRequested = false;
          return TVar9;
        }
        goto LAB_002dfb73;
      }
      (pDVar8->super_TimeData).mTimeState = time_granted;
      bVar6 = (cmd->actionTime).internalTimeCode;
      (pDVar8->super_TimeData).next.internalTimeCode = bVar6;
      (pDVar8->super_TimeData).Te.internalTimeCode = bVar6;
      (pDVar8->super_TimeData).minDe.internalTimeCode = bVar6;
      (pDVar8->super_TimeData).minFed.gid = -2010000000;
      (pDVar8->super_TimeData).timeoutCount = 0;
      (pDVar8->super_TimeData).interrupted = false;
      (pDVar8->super_TimeData).sequenceCounter = (uint)cmd->counter;
    }
    (pDVar8->super_TimeData).hasData = false;
  }
  return PROCESSED;
}

Assistant:

TimeProcessingResult TimeDependencies::updateTime(const ActionMessage& cmd)
{
    auto* depInfo = getDependencyInfo(cmd.source_id);
    if (depInfo == nullptr || !depInfo->dependency) {
        return TimeProcessingResult::NOT_PROCESSED;
    }
    return processMessage(cmd, *depInfo);
}